

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFPdu.cpp
# Opt level: O1

void __thiscall DIS::IFFPdu::IFFPdu(IFFPdu *this)

{
  DistributedEmissionsFamilyPdu::DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__IFFPdu_001b4e60;
  EntityID::EntityID(&this->_emittingEntityID);
  EventIdentifier::EventIdentifier(&this->_eventID);
  Vector3Float::Vector3Float(&this->_relativeAntennaLocation);
  this->_numberOfIFFParameters = 0;
  SystemIdentifier::SystemIdentifier(&this->_systemID);
  this->_systemDesignator = '\0';
  this->_systemSpecificData = '\0';
  FundamentalOperationalData::FundamentalOperationalData(&this->_fundamentalOperationalData);
  LayerHeader::LayerHeader(&this->_layerHeader);
  BeamData::BeamData(&this->_beamData);
  SecondaryOperationalData::SecondaryOperationalData(&this->_secondaryOperationalData);
  (this->_iffParameters).
  super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_iffParameters).
  super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_iffParameters).
  super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PduSuperclass::setPduType((PduSuperclass *)this,'\x1c');
  return;
}

Assistant:

IFFPdu::IFFPdu() : DistributedEmissionsFamilyPdu(),
   _emittingEntityID(), 
   _eventID(),
   _relativeAntennaLocation(),
   _numberOfIFFParameters(0),
   _systemID(),
   _systemDesignator(0),
   _systemSpecificData(0),
   _fundamentalOperationalData(),
   _layerHeader(),
   _beamData(),
   _secondaryOperationalData()
{
    setPduType( 28 );
}